

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

ssize_t correct_reed_solomon_decode
                  (correct_reed_solomon *rs,uint8_t *encoded,size_t encoded_length,uint8_t *msg)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  uint i_1;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint i;
  uint uVar9;
  polynomial_t msgpoly;
  polynomial_t locator_log;
  field_logarithm_t **element_exp;
  
  uVar6 = rs->block_length;
  uVar7 = 0xffffffffffffffff;
  if (encoded_length <= uVar6) {
    uVar8 = encoded_length - rs->min_distance;
    if (rs->has_init_decode == false) {
      correct_reed_solomon_decoder_create(rs);
    }
    for (uVar5 = 1; uVar5 - 1 < encoded_length; uVar5 = uVar5 + 1) {
      (rs->received_polynomial).coeff[uVar5 - 1] = encoded[encoded_length - uVar5];
    }
    for (uVar5 = 0; (ulong)uVar5 < uVar6 - encoded_length; uVar5 = uVar5 + 1) {
      (rs->received_polynomial).coeff[encoded_length + uVar5] = '\0';
    }
    uVar2 = (rs->received_polynomial).coeff;
    uVar3 = (rs->received_polynomial).order;
    msgpoly.order = uVar3;
    msgpoly.coeff = (field_element_t *)uVar2;
    msgpoly._12_4_ = 0;
    _Var4 = reed_solomon_find_syndromes
                      (rs->field,msgpoly,rs->generator_root_exp,rs->syndromes,rs->min_distance);
    if (_Var4) {
      for (uVar5 = 1; uVar7 = uVar8, uVar5 - 1 < uVar8; uVar5 = uVar5 + 1) {
        msg[uVar5 - 1] = (rs->received_polynomial).coeff[encoded_length - uVar5];
      }
    }
    else {
      uVar5 = reed_solomon_find_error_locator(rs,0);
      (rs->error_locator).order = uVar5;
      for (uVar9 = 0; uVar9 <= uVar5; uVar9 = uVar9 + 1) {
        (rs->error_locator_log).coeff[uVar9] = (rs->field).log[(rs->error_locator).coeff[uVar9]];
        uVar5 = (rs->error_locator).order;
      }
      (rs->error_locator_log).order = uVar5;
      element_exp = rs->element_exp;
      locator_log.order = uVar5;
      locator_log.coeff = (rs->error_locator_log).coeff;
      locator_log._12_4_ = 0;
      _Var4 = reed_solomon_factorize_error_locator
                        (rs->field,0,locator_log,rs->error_roots,element_exp);
      uVar7 = 0xffffffffffffffff;
      if (_Var4) {
        reed_solomon_find_error_locations
                  (rs->field,rs->generator_root_gap,rs->error_roots,rs->error_locations,
                   (rs->error_locator).order,(uint)element_exp);
        reed_solomon_find_error_values(rs);
        for (uVar6 = 0; uVar6 < (rs->error_locator).order; uVar6 = uVar6 + 1) {
          pbVar1 = (rs->received_polynomial).coeff + rs->error_locations[uVar6];
          *pbVar1 = *pbVar1 ^ rs->error_vals[uVar6];
        }
        for (uVar5 = 1; uVar7 = uVar8, uVar5 - 1 < uVar8; uVar5 = uVar5 + 1) {
          msg[uVar5 - 1] = (rs->received_polynomial).coeff[encoded_length - uVar5];
        }
      }
    }
  }
  return uVar7;
}

Assistant:

ssize_t correct_reed_solomon_decode(correct_reed_solomon *rs, const uint8_t *encoded, size_t encoded_length,
                                    uint8_t *msg) {
    if (encoded_length > rs->block_length) {
        return -1;
    }

    // the message is the non-remainder part
    size_t msg_length = encoded_length - rs->min_distance;
    // if they handed us a nonfull block, we'll write in 0s
    size_t pad_length = rs->block_length - encoded_length;

    if (!rs->has_init_decode) {
        // initialize rs for decoding
        correct_reed_solomon_decoder_create(rs);
    }

    // we need to copy to our local buffer
    // the buffer we're given has the coordinates in the wrong direction
    // e.g. byte 0 corresponds to the 254th order coefficient
    // so we're going to flip and then write padding
    // the final copied buffer will look like
    // | rem (rs->min_distance) | msg (msg_length) | pad (pad_length) |

    for (unsigned int i = 0; i < encoded_length; i++) {
        rs->received_polynomial.coeff[i] = encoded[encoded_length - (i + 1)];
    }

    // fill the pad_length with 0s
    for (unsigned int i = 0; i < pad_length; i++) {
        rs->received_polynomial.coeff[i + encoded_length] = 0;
    }


    bool all_zero = reed_solomon_find_syndromes(rs->field, rs->received_polynomial, rs->generator_root_exp,
                                                rs->syndromes, rs->min_distance);

    if (all_zero) {
        // syndromes were all zero, so there was no error in the message
        // copy to msg and we are done
        for (unsigned int i = 0; i < msg_length; i++) {
            msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
        }
        return msg_length;
    }

    unsigned int order = reed_solomon_find_error_locator(rs, 0);
    // XXX fix this vvvv
    rs->error_locator.order = order;

    for (unsigned int i = 0; i <= rs->error_locator.order; i++) {
        // this is a little strange since the coeffs are logs, not elements
        // also, we'll be storing log(0) = 0 for any 0 coeffs in the error locator
        // that would seem bad but we'll just be using this in chien search, and we'll skip all 0 coeffs
        // (you might point out that log(1) also = 0, which would seem to alias. however, that's ok,
        //   because log(1) = 255 as well, and in fact that's how it's represented in our log table)
        rs->error_locator_log.coeff[i] = rs->field.log[rs->error_locator.coeff[i]];
    }
    rs->error_locator_log.order = rs->error_locator.order;

    if (!reed_solomon_factorize_error_locator(rs->field, 0, rs->error_locator_log, rs->error_roots, rs->element_exp)) {
        // roots couldn't be found, so there were too many errors to deal with
        // RS has failed for this message
        return -1;
    }

    reed_solomon_find_error_locations(rs->field, rs->generator_root_gap, rs->error_roots, rs->error_locations,
                                      rs->error_locator.order, 0);

    reed_solomon_find_error_values(rs);

    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        rs->received_polynomial.coeff[rs->error_locations[i]] =
            field_sub(rs->field, rs->received_polynomial.coeff[rs->error_locations[i]], rs->error_vals[i]);
    }

    for (unsigned int i = 0; i < msg_length; i++) {
        msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
    }

    return msg_length;
}